

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O3

string * __thiscall
CLI::detail::
generate_map<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
          (string *__return_storage_ptr__,detail *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *map,bool key_only)

{
  string *in_R8;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
  local_68[0] = local_58;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_68,",","");
  join<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,CLI::detail::generate_map<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>(std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,bool)::_lambda(std::pair<std::__cxx11::string_const,int>const&)_1_,void>
            (&local_48,this,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)((ulong)map & 0xff),(anon_class_1_1_05c8830a)SUB81(local_68,0),in_R8);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string generate_map(const T &map, bool key_only = false) {
    using element_t = typename detail::element_type<T>::type;
    using iteration_type_t = typename detail::pair_adaptor<element_t>::value_type;  // the type of the object pair
    std::string out(1, '{');
    out.append(detail::join(
        detail::smart_deref(map),
        [key_only](const iteration_type_t &v) {
            std::string res{detail::to_string(detail::pair_adaptor<element_t>::first(v))};

            if(!key_only) {
                res.append("->");
                res += detail::to_string(detail::pair_adaptor<element_t>::second(v));
            }
            return res;
        },
        ","));
    out.push_back('}');
    return out;
}